

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeFuncInfoArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  uVar1 = *(uint *)buffer;
  uVar2 = *(uint *)(buffer + 5);
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 <= (ulong)uVar1 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1245,
                                "(serialized->offset + sizeof(AuxArray<FuncInfoEntry>) < deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(AuxArray<FuncInfoEntry>) < deserializeInto->GetLength()"
                               );
    if (!bVar4) goto LAB_00888a0c;
    *puVar6 = 0;
  }
  pbVar7 = ByteBlock::GetBuffer(deserializeInto);
  uVar10 = (ulong)*(uint *)buffer;
  *(uint *)(pbVar7 + uVar10) = uVar2;
  uVar1 = *(uint *)buffer;
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 < (ulong)uVar1 + (ulong)uVar2 * 8 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1248,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar4) {
LAB_00888a0c:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (0 < (int)uVar2) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      *(undefined4 *)(pbVar7 + lVar9 * 4 + uVar10 + 4) =
           *(undefined4 *)(buffer + (lVar8 >> 0x1e) + 9);
      *(undefined4 *)(pbVar7 + lVar9 * 4 + uVar10 + 8) =
           *(undefined4 *)(buffer + (long)((int)lVar9 + 1) * 4 + 9);
      lVar9 = lVar9 + 2;
      lVar8 = lVar8 + 0x200000000;
    } while ((ulong)uVar2 * 2 != lVar9);
  }
  return buffer + (long)(int)(uVar2 * 2) * 4 + 9;
}

Assistant:

const byte *
    DeserializeFuncInfoArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const SerializedFuncInfoArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxFuncInfoArray);
#endif
        auto count = serialized->count;

        Assert(serialized->offset + sizeof(AuxArray<FuncInfoEntry>) < deserializeInto->GetLength());
        auto result = (AuxArray<FuncInfoEntry> *)(deserializeInto->GetBuffer() + serialized->offset);
        result->count = count;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto elements = (int*)(serialized+1);
        for(int i=0;i<count;++i)
        {
            result->elements[i].nestedIndex = elements[i*2];
            result->elements[i].scopeSlot = elements[i*2+1];
        }
        auto current = buffer + sizeof(serialization_alignment const SerializedFuncInfoArray) + (count * 2 * sizeof(int));
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxFuncInfoArray);
#endif
        return current;
    }